

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::set_sequential_range
          (torrent *this,piece_index_t first_piece,piece_index_t last_piece)

{
  bool bVar1;
  int iVar2;
  session_settings *this_00;
  element_type *peVar3;
  pointer this_01;
  bool local_31;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_20;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_1c;
  torrent *local_18;
  torrent *this_local;
  piece_index_t last_piece_local;
  piece_index_t first_piece_local;
  
  local_18 = this;
  this_local._0_4_ = last_piece.m_val;
  this_local._4_4_ = first_piece.m_val;
  bVar1 = has_picker(this);
  if (!bVar1) {
    bVar1 = valid_metadata(this);
    if (!bVar1) {
      return;
    }
    if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x19 & 1) == 0) {
      return;
    }
    if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1e & 1) != 0) {
      this_00 = settings(this);
      iVar2 = session_settings::get_int(this_00,0x4019);
      if (iVar2 != 1) {
        return;
      }
    }
    need_picker(this);
  }
  peVar3 = ::std::
           __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_torrent_hot_members).m_torrent_file);
  local_1c.m_val = (int)torrent_info::last_piece(peVar3);
  bVar1 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator>
                    ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                     ((long)&this_local + 4),&local_1c);
  local_31 = true;
  if (!bVar1) {
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_torrent_hot_members).m_torrent_file);
    local_20.m_val = (int)torrent_info::last_piece(peVar3);
    local_31 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator>
                         ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)&this_local
                          ,&local_20);
  }
  if (local_31 == false) {
    this->field_0x5cc = this->field_0x5cc & 0xfe | 1;
    this_01 = ::std::
              unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
              ::operator->(&(this->super_torrent_hot_members).m_picker);
    piece_picker::set_sequential_range(this_01,this_local._4_4_,this_local._0_4_);
  }
  return;
}

Assistant:

void torrent::set_sequential_range(piece_index_t first_piece, piece_index_t last_piece)
	{
		if (!has_picker()) {
			if (!valid_metadata() || !m_connections_initialized) return;
			else if (!m_have_all
				|| settings().get_int(settings_pack::suggest_mode)
				== settings_pack::suggest_read_cache)
				need_picker();
			else return;
		}
		if (first_piece > m_torrent_file->last_piece() || last_piece > m_torrent_file->last_piece()) return;
		TORRENT_ASSERT_PRECOND(first_piece <= m_torrent_file->last_piece() && last_piece <= m_torrent_file->last_piece());
		m_sequential_download = true;
		m_picker->set_sequential_range(first_piece, last_piece);
	}